

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BinOpr token2binop(LexToken tok)

{
  undefined4 local_c;
  LexToken tok_local;
  
  if (tok == 0x25) {
    local_c = OPR_MOD;
  }
  else if (tok == 0x2a) {
    local_c = OPR_MUL;
  }
  else if (tok == 0x2b) {
    local_c = OPR_ADD;
  }
  else if (tok == 0x2d) {
    local_c = OPR_SUB;
  }
  else if (tok == 0x2f) {
    local_c = OPR_DIV;
  }
  else if (tok == 0x3c) {
    local_c = OPR_LT;
  }
  else if (tok == 0x3e) {
    local_c = OPR_GT;
  }
  else if (tok == 0x5e) {
    local_c = OPR_POW;
  }
  else if (tok == 0x101) {
    local_c = OPR_AND;
  }
  else if (tok == 0x110) {
    local_c = OPR_OR;
  }
  else if (tok == 0x117) {
    local_c = OPR_CONCAT;
  }
  else if (tok == 0x119) {
    local_c = OPR_EQ;
  }
  else if (tok == 0x11a) {
    local_c = OPR_GE;
  }
  else if (tok == 0x11b) {
    local_c = OPR_LE;
  }
  else if (tok == 0x11c) {
    local_c = OPR_NE;
  }
  else {
    local_c = OPR_NOBINOPR;
  }
  return local_c;
}

Assistant:

static BinOpr token2binop(LexToken tok)
{
  switch (tok) {
  case '+':	return OPR_ADD;
  case '-':	return OPR_SUB;
  case '*':	return OPR_MUL;
  case '/':	return OPR_DIV;
  case '%':	return OPR_MOD;
  case '^':	return OPR_POW;
  case TK_concat: return OPR_CONCAT;
  case TK_ne:	return OPR_NE;
  case TK_eq:	return OPR_EQ;
  case '<':	return OPR_LT;
  case TK_le:	return OPR_LE;
  case '>':	return OPR_GT;
  case TK_ge:	return OPR_GE;
  case TK_and:	return OPR_AND;
  case TK_or:	return OPR_OR;
  default:	return OPR_NOBINOPR;
  }
}